

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<float>::AutoFill(TPZMatrix<float> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float val;
  float local_64;
  int local_60;
  float local_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_60 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar2 = 0;
    do {
      local_58 = 0.0;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      lVar3 = 0;
      lVar4 = lVar3;
      if (lVar2 != 0 && local_60 != 0) {
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar3,lVar2);
          local_64 = extraout_XMM0_Da;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar3,&local_64);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar3);
          local_58 = local_58 + ABS(extraout_XMM0_Da_00);
          lVar3 = lVar3 + 1;
          lVar4 = lVar2;
        } while (lVar2 != lVar3);
      }
      for (; lVar3 = (this->super_TPZBaseMatrix).fCol, lVar4 < lVar3; lVar4 = lVar4 + 1) {
        local_5c = GetRandomVal(this);
        if (lVar2 != lVar4) {
          local_58 = local_58 + ABS(local_5c);
        }
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar2,lVar4,&local_5c);
        if (iVar1 == 0) {
          Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
        }
      }
      if ((this->super_TPZBaseMatrix).fRow == lVar3) {
        local_48 = (float)((uint)local_58 & (uint)DAT_014d8df0);
        uStack_44 = uStack_54 & DAT_014d8df0._4_4_;
        uStack_40 = uStack_50 & DAT_014d8df0._8_4_;
        uStack_3c = uStack_4c & DAT_014d8df0._12_4_;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar2);
        if (ABS(extraout_XMM0_Da_01) < local_48) {
          local_64 = local_58 + 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar2,&local_64);
        }
        if ((local_48 < 1e-06) &&
           ((*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar2)
           , ABS(extraout_XMM0_Da_02) < 1e-06)) {
          local_64 = 1.0;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar2,&local_64);
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}